

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

void __thiscall QTimeEdit::QTimeEdit(QTimeEdit *this,QTime time,QWidget *parent)

{
  long lVar1;
  ulong uVar2;
  QVariant *in_RDX;
  QTime in_ESI;
  QDateTimeEdit *in_RDI;
  long in_FS_OFFSET;
  ConnectionType in_stack_00000010;
  QWidget *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  Type parserType;
  QDateTimeEdit *this_00;
  Connection in_stack_ffffffffffffffc8;
  QTime in_stack_ffffffffffffffd0;
  int iVar3;
  offset_in_QDateTimeEdit_to_subr in_stack_fffffffffffffff0;
  
  parserType = (Type)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar2 = QTime::isValid();
  iVar3 = in_ESI.mds;
  if ((uVar2 & 1) == 0) {
    QTime::QTime((QTime *)&stack0xffffffffffffffd0,0,0,0,0);
    in_ESI.mds = in_stack_ffffffffffffffd0.mds;
  }
  ::QVariant::QVariant((QVariant *)&stack0xffffffffffffffd8,in_ESI);
  QDateTimeEdit::QDateTimeEdit(this_00,in_RDX,parserType,in_stack_ffffffffffffff98);
  ::QVariant::~QVariant((QVariant *)&stack0xffffffffffffffd8);
  *(undefined ***)&(in_RDI->super_QAbstractSpinBox).super_QWidget = &PTR_metaObject_00d11ec8;
  *(undefined ***)&(in_RDI->super_QAbstractSpinBox).super_QWidget.super_QPaintDevice =
       &PTR__QTimeEdit_00d120b8;
  QObject::connect<void(QDateTimeEdit::*)(QTime),void(QTimeEdit::*)(QTime)>
            ((Object *)CONCAT44(iVar3,in_ESI.mds),in_stack_fffffffffffffff0,
             (ContextType *)in_stack_ffffffffffffffc8.d_ptr,(offset_in_QTimeEdit_to_subr *)0x0,
             in_stack_00000010);
  QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QTimeEdit::QTimeEdit(QTime time, QWidget *parent)
    : QDateTimeEdit(time.isValid() ? time : QDATETIMEEDIT_TIME_MIN, QMetaType::QTime, parent)
{
    connect(this, &QTimeEdit::timeChanged, this, &QTimeEdit::userTimeChanged);
}